

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_nop_uvec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<unsigned_int,_3> res;
  Vector<float,_3> res_1;
  float local_24 [3];
  int local_18 [6];
  
  local_24[0] = c->in[0].m_data[2];
  local_24[1] = c->in[0].m_data[0];
  local_24[2] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = (uint)(long)local_24[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_1.m_data[2] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = (float)res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[local_18[lVar1]] = (float)res.m_data[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }